

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_flt3_ldst(DisasContext_conflict6 *ctx,uint32_t opc,int fd,int fs,int base,int index)

{
  TCGContext_conflict6 *s;
  uint uVar1;
  TCGTemp *pTVar2;
  TCGv_i64 a2;
  int iVar3;
  TCGOpcode opc_00;
  TCGContext_conflict6 *pTVar4;
  TCGv_i32 val;
  uintptr_t o;
  TCGv_i64 ret;
  
  s = ctx->uc->tcg_ctx;
  pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar2 - (long)s);
  if (base == 0) {
    base = index;
    if (index != 0) goto LAB_0099e555;
    opc_00 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
LAB_0099e57f:
    tcg_gen_op2_mips64el(s,opc_00,(TCGArg)pTVar2,(TCGArg)a2);
  }
  else if (index == 0) {
LAB_0099e555:
    if (s->cpu_gpr[base] != ret) {
      a2 = s->cpu_gpr[base] + (long)s;
      opc_00 = INDEX_op_mov_i64;
      goto LAB_0099e57f;
    }
  }
  else {
    pTVar4 = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (pTVar4,INDEX_op_add_i64,(TCGArg)((long)pTVar4 + (long)ret),
               (TCGArg)((long)&pTVar4->pool_cur + (long)s->cpu_gpr[(uint)base]),
               (TCGArg)((long)&pTVar4->pool_cur + (long)s->cpu_gpr[(uint)index]));
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(pTVar4,ret,ret);
    }
  }
  switch(opc) {
  case 0x4c000000:
    if ((ctx->hflags & 0x80) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    val = (TCGv_i32)((long)pTVar2 - (long)s);
    tcg_gen_qemu_ld_i64_mips64el(s,ret,ret,(long)ctx->mem_idx,MO_LESL);
    tcg_gen_extrl_i64_i32_mips64el(s,val,ret);
    gen_store_fpr32((DisasContext_conflict6 *)(ulong)ctx->hflags,(TCGv_i32)ctx->uc->tcg_ctx,(int)val
                   );
    break;
  case 0x4c000001:
    uVar1 = ctx->hflags;
    if (-1 < (char)uVar1) {
      generate_exception_err(ctx,0x14,0);
      uVar1 = ctx->hflags;
    }
    if (((fd & 1U) != 0) && ((uVar1 & 0x40) == 0)) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    val = (TCGv_i32)((long)pTVar2 - (long)s);
    tcg_gen_qemu_ld_i64_mips64el(s,(TCGv_i64)val,ret,(long)ctx->mem_idx,MO_64);
    uVar1 = ctx->hflags;
    pTVar4 = ctx->uc->tcg_ctx;
    iVar3 = (int)val;
    goto LAB_0099e731;
  default:
    goto switchD_0099e5a3_caseD_4c000002;
  case 0x4c000005:
    if ((~ctx->hflags & 0xc0) != 0) {
      generate_exception_err(ctx,0x14,0);
    }
    tcg_gen_andi_i64_mips64el(s,ret,ret,-8);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    val = (TCGv_i32)((long)pTVar2 - (long)s);
    tcg_gen_qemu_ld_i64_mips64el(s,(TCGv_i64)val,ret,(long)ctx->mem_idx,MO_64);
    uVar1 = ctx->hflags;
    pTVar4 = ctx->uc->tcg_ctx;
    iVar3 = (int)val;
LAB_0099e731:
    gen_store_fpr64((DisasContext_conflict6 *)(ulong)uVar1,(TCGv_i64)pTVar4,iVar3);
    break;
  case 0x4c000008:
    if ((ctx->hflags & 0x80) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    val = (TCGv_i32)((long)pTVar2 - (long)s);
    gen_load_fpr32((DisasContext_conflict6 *)(ulong)ctx->hflags,(TCGv_i32)ctx->uc->tcg_ctx,(int)val)
    ;
    tcg_gen_qemu_st_i32_mips64el(s,val,ret,(long)ctx->mem_idx,MO_32);
    break;
  case 0x4c000009:
    uVar1 = ctx->hflags;
    if (-1 < (char)uVar1) {
      generate_exception_err(ctx,0x14,0);
      uVar1 = ctx->hflags;
    }
    if (((fs & 1U) != 0) && ((uVar1 & 0x40) == 0)) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    val = (TCGv_i32)((long)pTVar2 - (long)s);
    uVar1 = ctx->hflags;
    pTVar4 = ctx->uc->tcg_ctx;
    iVar3 = (int)val;
    goto LAB_0099e7d9;
  case 0x4c00000d:
    if ((~ctx->hflags & 0xc0) != 0) {
      generate_exception_err(ctx,0x14,0);
    }
    tcg_gen_andi_i64_mips64el(s,ret,ret,-8);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    val = (TCGv_i32)((long)pTVar2 - (long)s);
    uVar1 = ctx->hflags;
    pTVar4 = ctx->uc->tcg_ctx;
    iVar3 = (int)val;
LAB_0099e7d9:
    gen_load_fpr64((DisasContext_conflict6 *)(ulong)uVar1,(TCGv_i64)pTVar4,iVar3);
    tcg_gen_qemu_st_i64_mips64el(s,(TCGv_i64)val,ret,(long)ctx->mem_idx,MO_64);
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(val + (long)s));
switchD_0099e5a3_caseD_4c000002:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret + (long)s));
  return;
}

Assistant:

static void gen_flt3_ldst(DisasContext *ctx, uint32_t opc,
                          int fd, int fs, int base, int index)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);

    if (base == 0) {
        gen_load_gpr(tcg_ctx, t0, index);
    } else if (index == 0) {
        gen_load_gpr(tcg_ctx, t0, base);
    } else {
        gen_op_addr_add(ctx, t0, tcg_ctx->cpu_gpr[base], tcg_ctx->cpu_gpr[index]);
    }
    /*
     * Don't do NOP if destination is zero: we must perform the actual
     * memory access.
     */
    switch (opc) {
    case OPC_LWXC1:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, ctx->mem_idx, MO_TESL);
            tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
            gen_store_fpr32(ctx, fp0, fd);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    case OPC_LDXC1:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_qemu_ld_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ);
            gen_store_fpr64(ctx, fp0, fd);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    case OPC_LUXC1:
        check_cp1_64bitmode(ctx);
        tcg_gen_andi_tl(tcg_ctx, t0, t0, ~0x7);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_qemu_ld_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ);
            gen_store_fpr64(ctx, fp0, fd);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    case OPC_SWXC1:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            gen_load_fpr32(ctx, fp0, fs);
            tcg_gen_qemu_st_i32(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEUL);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    case OPC_SDXC1:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fs);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            gen_load_fpr64(ctx, fp0, fs);
            tcg_gen_qemu_st_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    case OPC_SUXC1:
        check_cp1_64bitmode(ctx);
        tcg_gen_andi_tl(tcg_ctx, t0, t0, ~0x7);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            gen_load_fpr64(ctx, fp0, fs);
            tcg_gen_qemu_st_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
}